

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O1

void __thiscall
QItemEditorFactory::registerEditor
          (QItemEditorFactory *this,int userType,QItemEditorCreatorBase *creator)

{
  Span *pSVar1;
  long *plVar2;
  ulong uVar3;
  Data *pDVar4;
  ulong uVar5;
  QHash<int,_QItemEditorCreatorBase_*> *this_00;
  long in_FS_OFFSET;
  bool bVar6;
  const_iterator it;
  int local_3c;
  TryEmplaceResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->creatorMap;
  local_3c = userType;
  it = QHash<int,_QItemEditorCreatorBase_*>::constFindImpl<int>(this_00,&local_3c);
  if (it.i.d == (Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *)0x0 && it.i.bucket == 0)
  goto LAB_00566411;
  pSVar1 = (it.i.d)->spans;
  uVar5 = it.i.bucket >> 7;
  plVar2 = *(long **)(pSVar1[uVar5].entries[pSVar1[uVar5].offsets[(uint)it.i.bucket & 0x7f]].storage
                      .data + 8);
  QHash<int,_QItemEditorCreatorBase_*>::erase(this_00,it);
  pDVar4 = this_00->d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
LAB_00566377:
    uVar5 = 0;
  }
  else {
    if (pDVar4->spans->offsets[0] != 0xff) goto LAB_00566377;
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (pDVar4->numBuckets == uVar5) {
        pDVar4 = (Data *)0x0;
        uVar5 = 0;
        break;
      }
      uVar3 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  }
  if (pDVar4 == (Data *)0x0 && uVar5 == 0) {
    bVar6 = false;
  }
  else {
    do {
      pSVar1 = pDVar4->spans;
      if (*(long **)(pSVar1[uVar5 >> 7].entries[pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].
                     storage.data + 8) == plVar2) break;
      do {
        if (pDVar4->numBuckets - 1 == uVar5) {
          uVar5 = 0;
          pDVar4 = (Data *)0x0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pSVar1[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while ((uVar5 != 0) || (pDVar4 != (Data *)0x0));
    bVar6 = uVar5 != 0 || pDVar4 != (Data *)0x0;
  }
  if ((!bVar6) && (plVar2 != (long *)0x0)) {
    (**(code **)(*plVar2 + 8))(plVar2);
  }
LAB_00566411:
  QHash<int,QItemEditorCreatorBase*>::tryEmplace_impl<int_const&>(&local_38,this_00,&local_3c);
  *(QItemEditorCreatorBase **)
   ((local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].entries
    [(local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].offsets
     [(uint)local_38.iterator.i.bucket & 0x7f]].storage.data + 8) = creator;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemEditorFactory::registerEditor(int userType, QItemEditorCreatorBase *creator)
{
    const auto it = creatorMap.constFind(userType);
    if (it != creatorMap.cend()) {
        QItemEditorCreatorBase *oldCreator = it.value();
        Q_ASSERT(oldCreator);
        creatorMap.erase(it);
        if (std::find(creatorMap.cbegin(), creatorMap.cend(), oldCreator) == creatorMap.cend())
            delete oldCreator; // if it is no more in use we can delete it
    }

    creatorMap[userType] = creator;
}